

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::updatePaintedViewBoundingRects(QGraphicsItemPrivate *this,bool updateChildren)

{
  QGraphicsViewPrivate *this_00;
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Representation RVar3;
  Representation RVar4;
  QRect QVar5;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->scene != (QGraphicsScene *)0x0) {
    lVar1 = *(long *)&this->scene->field_0x8;
    if (*(long *)(lVar1 + 0x290) != 0) {
      uVar2 = 0;
      do {
        this_00 = *(QGraphicsViewPrivate **)(*(long *)(*(long *)(lVar1 + 0x288) + uVar2 * 8) + 8);
        uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QVar5 = QHash<QWidget_*,_QRect>::value
                          (&this->paintedViewBoundingRects,
                           &(this_00->super_QAbstractScrollAreaPrivate).viewport);
        RVar3 = (this_00->dirtyScrollOffset).xp;
        RVar4 = (this_00->dirtyScrollOffset).yp;
        local_48._0_4_ = QVar5.x1.m_i;
        local_48._4_4_ = QVar5.y1.m_i;
        uStack_40._0_4_ = QVar5.x2.m_i;
        uStack_40._4_4_ = QVar5.y2.m_i;
        local_48._4_4_ = RVar4.m_i + local_48._4_4_;
        local_48._0_4_ = RVar3.m_i + local_48._0_4_;
        uStack_40._0_4_ = RVar3.m_i + uStack_40._0_4_;
        uStack_40._4_4_ = RVar4.m_i + uStack_40._4_4_;
        QGraphicsViewPrivate::updateRect(this_00,(QRect *)&local_48);
        uVar2 = uVar2 + 1;
        lVar1 = *(long *)&this->scene->field_0x8;
      } while (uVar2 < *(ulong *)(lVar1 + 0x290));
    }
    if ((updateChildren) && ((this->children).d.size != 0)) {
      uVar2 = 0;
      do {
        updatePaintedViewBoundingRects(((this->children).d.ptr[uVar2]->d_ptr).d,true);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)(this->children).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::updatePaintedViewBoundingRects(bool updateChildren)
{
    if (!scene)
        return;

    for (int i = 0; i < scene->d_func()->views.size(); ++i) {
        QGraphicsViewPrivate *viewPrivate = scene->d_func()->views.at(i)->d_func();
        QRect rect = paintedViewBoundingRects.value(viewPrivate->viewport);
        rect.translate(viewPrivate->dirtyScrollOffset);
        viewPrivate->updateRect(rect);
    }

    if (updateChildren) {
        for (int i = 0; i < children.size(); ++i)
            children.at(i)->d_ptr->updatePaintedViewBoundingRects(true);
    }
}